

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O3

int TVMArrayFromDLPack(DLManagedTensor *from,TVMArrayHandle *out)

{
  DLContext DVar1;
  int64_t *piVar2;
  int64_t *piVar3;
  uint64_t uVar4;
  int iVar5;
  DLDataType DVar6;
  DLTensor *tensor;
  TVMArrayHandle pTVar7;
  NDArray local_18;
  
  pTVar7 = (TVMArrayHandle)operator_new(0x60);
  pTVar7[1].strides = (int64_t *)0x0;
  pTVar7[1].byte_offset = 0;
  pTVar7[1].ndim = 0;
  pTVar7[1].dtype.code = '\0';
  pTVar7[1].dtype.bits = '\0';
  pTVar7[1].dtype.lanes = 0;
  pTVar7[1].shape = (int64_t *)0x0;
  pTVar7[1].ctx = (DLContext)tvm::runtime::NDArray::Internal::DLPackDeleter;
  pTVar7[1].data = from;
  DVar1 = (from->dl_tensor).ctx;
  iVar5 = (from->dl_tensor).ndim;
  DVar6 = (from->dl_tensor).dtype;
  piVar2 = (from->dl_tensor).shape;
  piVar3 = (from->dl_tensor).strides;
  uVar4 = (from->dl_tensor).byte_offset;
  pTVar7->data = (from->dl_tensor).data;
  pTVar7->ctx = DVar1;
  pTVar7->ndim = iVar5;
  pTVar7->dtype = DVar6;
  pTVar7->shape = piVar2;
  pTVar7->strides = piVar3;
  pTVar7->byte_offset = uVar4;
  LOCK();
  pTVar7[1].dtype = (DLDataType)((int)pTVar7[1].dtype + 1);
  UNLOCK();
  local_18.data_ = (Container *)0x0;
  *out = pTVar7;
  tvm::runtime::NDArray::~NDArray(&local_18);
  return 0;
}

Assistant:

int TVMArrayFromDLPack(DLManagedTensor *from,
                       TVMArrayHandle *out) {
  API_BEGIN();
  *out = NDArray::Internal::MoveAsDLTensor(NDArray::FromDLPack(from));
  API_END();
}